

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O1

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  long *plVar2;
  qreal *pqVar3;
  qreal qVar4;
  int iVar5;
  QPointF *offset;
  QColor *color;
  long in_FS_OFFSET;
  undefined4 uVar6;
  undefined4 uVar7;
  QColor QVar8;
  QPointF QVar9;
  undefined8 local_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_48._8_8_ = _a[1];
    iVar5 = 0;
    goto LAB_0039a88c;
  case 1:
    local_50 = *_a[1];
    local_48._8_8_ = &local_50;
    iVar5 = 1;
    goto LAB_0039a88c;
  case 2:
    local_48._8_8_ = _a[1];
    iVar5 = 2;
LAB_0039a88c:
    local_48._0_8_ = (undefined8 *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)local_48);
    break;
  case 3:
    offset = (QPointF *)_a[1];
    goto LAB_0039a8a9;
  case 4:
    local_48._0_8_ = *_a[1];
    local_48._8_8_ = *_a[2];
    offset = (QPointF *)local_48;
    goto LAB_0039a8a9;
  case 5:
    local_48._0_8_ = *_a[1];
    offset = (QPointF *)local_48;
    local_48._8_8_ = local_48._0_8_;
LAB_0039a8a9:
    setOffset((QGraphicsDropShadowEffect *)_o,offset);
    break;
  case 6:
    setXOffset((QGraphicsDropShadowEffect *)_o,*_a[1]);
    break;
  case 7:
    setYOffset((QGraphicsDropShadowEffect *)_o,*_a[1]);
    break;
  case 8:
    setBlurRadius((QGraphicsDropShadowEffect *)_o,*_a[1]);
    break;
  case 9:
    setColor((QGraphicsDropShadowEffect *)_o,(QColor *)_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0039a786_caseD_3;
      plVar2 = (long *)_a[1];
      if (((code *)*plVar2 == offsetChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_0039a786_caseD_3;
      }
      if (((code *)*plVar2 == blurRadiusChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_0039a786_caseD_3;
      }
      if (((code *)*plVar2 == colorChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_0039a786_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_0039a786_caseD_3;
        goto switchD_0039a786_caseD_1;
      }
    }
    goto switchD_0039a786_caseD_2;
  }
switchD_0039a786_caseD_1:
  if (4 < (uint)_id) goto LAB_0039aa11;
  pqVar3 = (qreal *)*_a;
  switch(_id) {
  case 0:
    QVar9 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8))
    ;
    *pqVar3 = QVar9.xp;
    pqVar3[1] = QVar9.yp;
    break;
  case 1:
    QVar9 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8))
    ;
    uVar6 = QVar9.xp._0_4_;
    uVar7 = QVar9.xp._4_4_;
    goto LAB_0039aa0b;
  case 2:
    QVar9 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8))
    ;
    *pqVar3 = QVar9.yp;
    break;
  case 3:
    qVar4 = QPixmapDropShadowFilter::blurRadius
                      (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
    uVar6 = SUB84(qVar4,0);
    uVar7 = (undefined4)((ulong)qVar4 >> 0x20);
LAB_0039aa0b:
    *pqVar3 = (qreal)CONCAT44(uVar7,uVar6);
    break;
  case 4:
    QVar8 = QPixmapDropShadowFilter::color(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
    *pqVar3 = QVar8._0_8_;
    *(int *)(pqVar3 + 1) = QVar8.ct._4_4_;
    *(short *)((long)pqVar3 + 0xc) = QVar8.ct._8_2_;
  }
LAB_0039aa11:
  if (_c != WriteProperty) goto switchD_0039a786_caseD_3;
switchD_0039a786_caseD_2:
  if (4 < (uint)_id) goto switchD_0039a786_caseD_3;
  color = (QColor *)*_a;
  switch(_id) {
  case 1:
    puVar1 = *(undefined8 **)color;
    QVar9 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8))
    ;
    local_48._8_8_ = QVar9.yp;
    color = (QColor *)local_48;
    local_48._0_8_ = puVar1;
    break;
  case 2:
    puVar1 = *(undefined8 **)color;
    QVar9 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8))
    ;
    color = (QColor *)local_48;
    local_48._0_8_ = (undefined8 *)QVar9.xp;
    local_48._8_8_ = puVar1;
    break;
  case 3:
    setBlurRadius((QGraphicsDropShadowEffect *)_o,*(qreal *)color);
    goto switchD_0039a786_caseD_3;
  case 4:
    setColor((QGraphicsDropShadowEffect *)_o,color);
    goto switchD_0039a786_caseD_3;
  }
  setOffset((QGraphicsDropShadowEffect *)_o,(QPointF *)color);
switchD_0039a786_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsDropShadowEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->offsetChanged((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 1: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 2: _t->colorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 3: _t->setOffset((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 4: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qreal>>(_a[2]))); break;
        case 5: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 6: _t->setXOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 7: _t->setYOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 9: _t->setColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QPointF & )>(_a, &QGraphicsDropShadowEffect::offsetChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(qreal )>(_a, &QGraphicsDropShadowEffect::blurRadiusChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QColor & )>(_a, &QGraphicsDropShadowEffect::colorChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPointF*>(_v) = _t->offset(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xOffset(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yOffset(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 4: *reinterpret_cast<QColor*>(_v) = _t->color(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOffset(*reinterpret_cast<QPointF*>(_v)); break;
        case 1: _t->setXOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast<QColor*>(_v)); break;
        default: break;
        }
    }
}